

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O0

DdNode * extraBddSpaceEquationsPos(DdManager *dd,DdNode *bF)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  DdNode *Q;
  DdNode *Q_00;
  DdNode *E;
  DdNode *T;
  DdNode *zRes1;
  DdNode *zRes0;
  DdNode *zRes_1;
  DdNode *zNeg1;
  DdNode *zPos1;
  DdNode *zPos0;
  DdNode *bF1;
  DdNode *bF0;
  DdNode *bFR;
  DdNode *zRes;
  DdNode *bF_local;
  DdManager *dd_local;
  
  if (bF == (DdNode *)((ulong)dd->one ^ 1)) {
    dd_local = (DdManager *)dd->one;
  }
  else if (bF == dd->one) {
    dd_local = (DdManager *)dd->zero;
  }
  else {
    dd_local = (DdManager *)cuddCacheLookup1Zdd(dd,extraBddSpaceEquationsPos,bF);
    if (dd_local == (DdManager *)0x0) {
      pDVar1 = (DdNode *)((ulong)bF & 0xfffffffffffffffe);
      if (pDVar1 == bF) {
        bF1 = (pDVar1->type).kids.E;
        zPos0 = (pDVar1->type).kids.T;
      }
      else {
        bF1 = (DdNode *)((ulong)(pDVar1->type).kids.E ^ 1);
        zPos0 = (DdNode *)((ulong)(pDVar1->type).kids.T ^ 1);
      }
      if (bF1 == (DdNode *)((ulong)dd->one ^ 1)) {
        pDVar2 = extraBddSpaceEquationsPos(dd,zPos0);
        if (pDVar2 == (DdNode *)0x0) {
          return (DdNode *)0x0;
        }
        *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
        zRes0 = cuddZddGetNode(dd,pDVar1->index << 1,dd->one,pDVar2);
        if (zRes0 == (DdNode *)0x0) {
          Cudd_RecursiveDerefZdd(dd,pDVar2);
          return (DdNode *)0x0;
        }
        *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + -1;
      }
      else if (zPos0 == (DdNode *)((ulong)dd->one ^ 1)) {
        zRes0 = extraBddSpaceEquationsPos(dd,bF1);
        if (zRes0 == (DdNode *)0x0) {
          return (DdNode *)0x0;
        }
      }
      else {
        pDVar2 = extraBddSpaceEquationsPos(dd,bF1);
        if (pDVar2 == (DdNode *)0x0) {
          return (DdNode *)0x0;
        }
        *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
        Q = extraBddSpaceEquationsPos(dd,zPos0);
        if (Q == (DdNode *)0x0) {
          Cudd_RecursiveDerefZdd(dd,pDVar2);
          return (DdNode *)0x0;
        }
        *(int *)(((ulong)Q & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)Q & 0xfffffffffffffffe) + 4) + 1;
        Q_00 = extraBddSpaceEquationsNeg(dd,zPos0);
        if (Q_00 == (DdNode *)0x0) {
          Cudd_RecursiveDerefZdd(dd,pDVar2);
          Cudd_RecursiveDerefZdd(dd,Q);
          return (DdNode *)0x0;
        }
        *(int *)(((ulong)Q_00 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)Q_00 & 0xfffffffffffffffe) + 4) + 1;
        E = cuddZddIntersect(dd,pDVar2,Q);
        if (E == (DdNode *)0x0) {
          Cudd_RecursiveDerefZdd(dd,Q_00);
          Cudd_RecursiveDerefZdd(dd,pDVar2);
          Cudd_RecursiveDerefZdd(dd,Q);
          return (DdNode *)0x0;
        }
        *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + 1;
        T = cuddZddIntersect(dd,pDVar2,Q_00);
        if (T == (DdNode *)0x0) {
          Cudd_RecursiveDerefZdd(dd,E);
          Cudd_RecursiveDerefZdd(dd,Q_00);
          Cudd_RecursiveDerefZdd(dd,pDVar2);
          Cudd_RecursiveDerefZdd(dd,Q);
          return (DdNode *)0x0;
        }
        *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) + 1;
        Cudd_RecursiveDerefZdd(dd,Q_00);
        Cudd_RecursiveDerefZdd(dd,pDVar2);
        Cudd_RecursiveDerefZdd(dd,Q);
        zRes0 = cuddZddGetNode(dd,pDVar1->index << 1,T,E);
        if (zRes0 == (DdNode *)0x0) {
          Cudd_RecursiveDerefZdd(dd,E);
          Cudd_RecursiveDerefZdd(dd,T);
          return (DdNode *)0x0;
        }
        *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + -1;
        *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) + -1;
      }
      cuddCacheInsert1(dd,extraBddSpaceEquationsPos,bF,zRes0);
      dd_local = (DdManager *)zRes0;
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode * extraBddSpaceEquationsPos( DdManager * dd, DdNode * bF )
{
    DdNode * zRes;
    statLine( dd );

    if ( bF == b0 )
        return z1;
    if ( bF == b1 )
        return z0;
    
    if ( (zRes = cuddCacheLookup1Zdd(dd, extraBddSpaceEquationsPos, bF)) )
        return zRes;
    else
    {
        DdNode * bFR, * bF0,  * bF1;
        DdNode * zPos0, * zPos1, * zNeg1; 
        DdNode * zRes, * zRes0, * zRes1;

        bFR = Cudd_Regular(bF);
        if ( bFR != bF ) // bF is complemented 
        {
            bF0 = Cudd_Not( cuddE(bFR) );
            bF1 = Cudd_Not( cuddT(bFR) );
        }
        else
        {
            bF0 = cuddE(bFR);
            bF1 = cuddT(bFR);
        }

        if ( bF0 == b0 )
        {
            zRes1 = extraBddSpaceEquationsPos( dd, bF1 );
            if ( zRes1 == NULL )
                return NULL;
            cuddRef( zRes1 );

            // add the current element to the set
            zRes = cuddZddGetNode( dd, 2*bFR->index, z1, zRes1 );
            if ( zRes == NULL ) 
            {
                Cudd_RecursiveDerefZdd(dd, zRes1);
                return NULL;
            }
            cuddDeref( zRes1 );
        }
        else if ( bF1 == b0 )
        {
            zRes = extraBddSpaceEquationsPos( dd, bF0 );
            if ( zRes == NULL )
                return NULL;
        }
        else
        {
            zPos0 = extraBddSpaceEquationsPos( dd, bF0 );
            if ( zPos0 == NULL )
                return NULL;
            cuddRef( zPos0 );

            zPos1 = extraBddSpaceEquationsPos( dd, bF1 );
            if ( zPos1 == NULL )
            {
                Cudd_RecursiveDerefZdd(dd, zPos0);
                return NULL;
            }
            cuddRef( zPos1 );

            zNeg1 = extraBddSpaceEquationsNeg( dd, bF1 );
            if ( zNeg1 == NULL )
            {
                Cudd_RecursiveDerefZdd(dd, zPos0);
                Cudd_RecursiveDerefZdd(dd, zPos1);
                return NULL;
            }
            cuddRef( zNeg1 );


            zRes0 = cuddZddIntersect( dd, zPos0, zPos1 );
            if ( zRes0 == NULL )
            {
                Cudd_RecursiveDerefZdd(dd, zNeg1);
                Cudd_RecursiveDerefZdd(dd, zPos0);
                Cudd_RecursiveDerefZdd(dd, zPos1);
                return NULL;
            }
            cuddRef( zRes0 );

            zRes1 = cuddZddIntersect( dd, zPos0, zNeg1 );
            if ( zRes1 == NULL )
            {
                Cudd_RecursiveDerefZdd(dd, zRes0);
                Cudd_RecursiveDerefZdd(dd, zNeg1);
                Cudd_RecursiveDerefZdd(dd, zPos0);
                Cudd_RecursiveDerefZdd(dd, zPos1);
                return NULL;
            }
            cuddRef( zRes1 );
            Cudd_RecursiveDerefZdd(dd, zNeg1);
            Cudd_RecursiveDerefZdd(dd, zPos0);
            Cudd_RecursiveDerefZdd(dd, zPos1);
            // only zRes0 and zRes1 are refed at this point

            zRes = cuddZddGetNode( dd, 2*bFR->index, zRes1, zRes0 );
            if ( zRes == NULL ) 
            {
                Cudd_RecursiveDerefZdd(dd, zRes0);
                Cudd_RecursiveDerefZdd(dd, zRes1);
                return NULL;
            }
            cuddDeref( zRes0 );
            cuddDeref( zRes1 );
        }

        cuddCacheInsert1( dd, extraBddSpaceEquationsPos, bF, zRes );
        return zRes;
    }
}